

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::submit
          (BufferCopyToImage *this,SubmitContext *context)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  VkCommandBuffer pVVar2;
  VkBuffer VVar3;
  Handle<(vk::HandleType)9> *pHVar4;
  undefined8 local_60;
  VkBufferImageCopy region;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  BufferCopyToImage *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar1 = Context::getDeviceInterface(this_00);
  pVVar2 = SubmitContext::getCommandBuffer(context);
  local_60 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region.bufferRowLength = 1;
  region.bufferImageHeight = 0;
  region.imageSubresource.aspectMask = 0;
  region.imageSubresource.mipLevel = 1;
  region.imageSubresource.baseArrayLayer = 0;
  region.imageSubresource.layerCount = 0;
  region.imageOffset.x = 0;
  region.imageOffset.y = this->m_imageWidth;
  region.imageOffset.z = this->m_imageHeight;
  region.imageExtent.width = 1;
  region.imageExtent._4_8_ = pVVar2;
  VVar3 = SubmitContext::getBuffer(context);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (*pDVar1->_vptr_DeviceInterface[0x62])
            (pDVar1,pVVar2,VVar3.m_internal,pHVar4->m_internal,7,1,&local_60);
  return;
}

Assistant:

void BufferCopyToImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkBufferImageCopy	region			=
	{
		0,
		0, 0,
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },
		{
			(deUint32)m_imageWidth,
			(deUint32)m_imageHeight,
			1u
		}
	};

	vkd.cmdCopyBufferToImage(commandBuffer, context.getBuffer(), *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
}